

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
emplaceValue<QGuiApplicationPrivate::SynthesizedMouseData>
          (Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *this,
          SynthesizedMouseData *args)

{
  long in_FS_OFFSET;
  SynthesizedMouseData local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.pos.xp = (args->pos).xp;
  local_48.pos.yp = (args->pos).yp;
  local_48.screenPos.xp = (args->screenPos).xp;
  local_48.screenPos.yp = (args->screenPos).yp;
  local_48.window.wp.d = (args->window).wp.d;
  local_48.window.wp.value = (args->window).wp.value;
  (args->window).wp.d = (Data *)0x0;
  (args->window).wp.value = (QObject *)0x0;
  QGuiApplicationPrivate::SynthesizedMouseData::operator=(&this->value,&local_48);
  QWeakPointer<QObject>::~QWeakPointer(&local_48.window.wp);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }